

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void fts5FreeCursorComponents(Fts5Cursor *pCsr)

{
  sqlite3_vtab *psVar1;
  sqlite3_stmt *pStmt;
  char *pcVar2;
  Fts5Sorter *p;
  Fts5Auxdata *pFVar3;
  long lVar4;
  sqlite3_blob *pBlob;
  Fts5Auxdata *p_00;
  int iVar5;
  ulong uVar6;
  Fts5Sorter *pSorter;
  
  psVar1 = (pCsr->base).pVtab;
  sqlite3_free(pCsr->aInstIter);
  sqlite3_free(pCsr->aInst);
  pStmt = pCsr->pStmt;
  if (pStmt != (sqlite3_stmt *)0x0) {
    uVar6 = 2;
    if (pCsr->ePlan == 5) {
      uVar6 = (ulong)(pCsr->bDesc != 0);
    }
    pcVar2 = psVar1[1].zErrMsg;
    if (*(long *)(pcVar2 + uVar6 * 8 + 0x30) == 0) {
      sqlite3_reset(pStmt);
      *(sqlite3_stmt **)(pcVar2 + uVar6 * 8 + 0x30) = pStmt;
    }
    else {
      sqlite3_finalize(pStmt);
    }
  }
  p = pCsr->pSorter;
  if (p != (Fts5Sorter *)0x0) {
    sqlite3_finalize(p->pStmt);
    sqlite3_free(p);
  }
  if (pCsr->ePlan != 2) {
    sqlite3Fts5ExprFree(pCsr->pExpr);
  }
  p_00 = pCsr->pAuxdata;
  while (p_00 != (Fts5Auxdata *)0x0) {
    pFVar3 = p_00->pNext;
    if (p_00->xDelete != (_func_void_void_ptr *)0x0) {
      (*p_00->xDelete)(p_00->pPtr);
    }
    sqlite3_free(p_00);
    p_00 = pFVar3;
  }
  sqlite3_finalize(pCsr->pRankArgStmt);
  sqlite3_free(pCsr->apRankArg);
  if ((pCsr->csrflags & 0x10) != 0) {
    sqlite3_free(pCsr->zRank);
    sqlite3_free(pCsr->zRankArgs);
  }
  lVar4 = *(long *)&psVar1[1].nRef;
  pBlob = *(sqlite3_blob **)(lVar4 + 0x48);
  if (pBlob != (sqlite3_blob *)0x0) {
    *(undefined8 *)(lVar4 + 0x48) = 0;
    iVar5 = sqlite3_blob_close(pBlob);
    if (*(int *)(lVar4 + 0x3c) == 0) {
      *(int *)(lVar4 + 0x3c) = iVar5;
    }
  }
  *(undefined4 *)(lVar4 + 0x3c) = 0;
  memset(&pCsr->ePlan,0,0x98);
  return;
}

Assistant:

static void fts5FreeCursorComponents(Fts5Cursor *pCsr){
  Fts5FullTable *pTab = (Fts5FullTable*)(pCsr->base.pVtab);
  Fts5Auxdata *pData;
  Fts5Auxdata *pNext;

  sqlite3_free(pCsr->aInstIter);
  sqlite3_free(pCsr->aInst);
  if( pCsr->pStmt ){
    int eStmt = fts5StmtType(pCsr);
    sqlite3Fts5StorageStmtRelease(pTab->pStorage, eStmt, pCsr->pStmt);
  }
  if( pCsr->pSorter ){
    Fts5Sorter *pSorter = pCsr->pSorter;
    sqlite3_finalize(pSorter->pStmt);
    sqlite3_free(pSorter);
  }

  if( pCsr->ePlan!=FTS5_PLAN_SOURCE ){
    sqlite3Fts5ExprFree(pCsr->pExpr);
  }

  for(pData=pCsr->pAuxdata; pData; pData=pNext){
    pNext = pData->pNext;
    if( pData->xDelete ) pData->xDelete(pData->pPtr);
    sqlite3_free(pData);
  }

  sqlite3_finalize(pCsr->pRankArgStmt);
  sqlite3_free(pCsr->apRankArg);

  if( CsrFlagTest(pCsr, FTS5CSR_FREE_ZRANK) ){
    sqlite3_free(pCsr->zRank);
    sqlite3_free(pCsr->zRankArgs);
  }

  sqlite3Fts5IndexCloseReader(pTab->p.pIndex);
  memset(&pCsr->ePlan, 0, sizeof(Fts5Cursor) - ((u8*)&pCsr->ePlan - (u8*)pCsr));
}